

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_matrix.cpp
# Opt level: O0

ostream * operator<<(ostream *out,ExtendedMatrix *matrix)

{
  string local_68;
  string local_38;
  ExtendedMatrix *local_18;
  ExtendedMatrix *matrix_local;
  ostream *out_local;
  
  local_18 = matrix;
  matrix_local = (ExtendedMatrix *)out;
  if (Options::output_type == 0) {
    ExtendedMatrix::ToString_abi_cxx11_(&local_38,matrix);
    std::operator<<(out,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else if (Options::output_type == 1) {
    ExtendedMatrix::ToLaTex_abi_cxx11_(&local_68,matrix);
    std::operator<<(out,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return (ostream *)matrix_local;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ExtendedMatrix& matrix) {
  if (Options::output_type == Options::OutputType::Standard) {
    out << matrix.ToString();
  } else if (Options::output_type == Options::OutputType::LaTex){
    out << matrix.ToLaTex();
  }

  return out;
}